

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_inexact_to_exact(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  int iVar1;
  sexp psVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  double dVar4;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffc0;
  double dVar5;
  sexp in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  sexp psVar6;
  undefined8 n_00;
  
  psVar6 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc8,0,0x10);
  if ((((in_RCX & 1) != 1) && (((in_RCX & 3) != 0 || (((sexp)in_RCX)->tag != 0xc)))) &&
     (((in_RCX & 3) != 0 || (((sexp)in_RCX)->tag != 0xd)))) {
    if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xb)) {
      iVar3 = 1;
      if ((long)(((sexp)in_RCX)->value).flonum < 0) {
        iVar3 = -1;
      }
      iVar1 = 0;
      if (ABS((((sexp)in_RCX)->value).flonum) == INFINITY) {
        iVar1 = iVar3;
      }
      if ((iVar1 != 0) || (NAN((((sexp)in_RCX)->value).flonum))) {
        in_RCX = sexp_xtype_exception
                           ((sexp)in_RCX,psVar6,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
        ;
      }
      else {
        dVar5 = (((sexp)in_RCX)->value).flonum;
        dVar4 = trunc((((sexp)in_RCX)->value).flonum);
        if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) {
          in_RCX = sexp_double_to_ratio_2(z,(double)res);
        }
        else if ((4.611686018427388e+18 < (((sexp)in_RCX)->value).flonum) ||
                ((((sexp)in_RCX)->value).flonum <= -4.611686018427388e+18 &&
                 (((sexp)in_RCX)->value).flonum != -4.611686018427388e+18)) {
          in_RCX = sexp_double_to_bignum(res,(double)__sexp_gc_preserver1.next);
        }
        else {
          in_RCX = (long)(((sexp)in_RCX)->value).flonum << 1 | 1;
        }
      }
    }
    else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xe)) {
      psVar6 = *(sexp *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc8;
      n_00 = in_RCX;
      in_RCX = sexp_make_complex(psVar6,(sexp)&stack0xffffffffffffffd8,in_stack_ffffffffffffffc0);
      psVar2 = sexp_inexact_to_exact((sexp)in_RSI,(sexp)in_RDX,n_00,(sexp)in_RCX);
      (((sexp)in_RCX)->value).type.name = psVar2;
      psVar2 = sexp_inexact_to_exact((sexp)in_RSI,(sexp)in_RDX,n_00,(sexp)in_RCX);
      (((sexp)in_RCX)->value).type.cpl = psVar2;
      if ((((((sexp)in_RCX)->value).stack.length & 3) == 0) &&
         (((((sexp)in_RCX)->value).type.name)->tag == 0x13)) {
        in_RCX = (((sexp)in_RCX)->value).flonum;
      }
      else if ((((((sexp)in_RCX)->value).string.offset & 3) == 0) &&
              (((((sexp)in_RCX)->value).type.cpl)->tag == 0x13)) {
        in_RCX = (((sexp)in_RCX)->value).type.cpl;
      }
      else if ((((sexp)in_RCX)->value).type.cpl == (sexp)0x1) {
        in_RCX = (((sexp)in_RCX)->value).flonum;
      }
      *(sexp *)(in_RDI + 0x6080) = psVar6;
    }
    else {
      in_RCX = sexp_type_exception((sexp)in_RCX,psVar6,(sexp_uint_t)in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffc8);
    }
  }
  return (sexp)in_RCX;
}

Assistant:

sexp sexp_inexact_to_exact (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  sexp_gc_var1(res);
  if (sexp_exactp(z)) {
    res = z;
  }
#if SEXP_USE_FLONUMS
  else if (sexp_flonump(z)) {
    if (isinf(sexp_flonum_value(z)) || isnan(sexp_flonum_value(z))) {
      res = sexp_xtype_exception(ctx, self, "exact: not a finite number", z);
    } else if (sexp_flonum_value(z) != trunc(sexp_flonum_value(z))) {
#if SEXP_USE_RATIOS
      res = sexp_double_to_ratio_2(ctx, sexp_flonum_value(z));
#else
      res = sexp_xtype_exception(ctx, self, "exact: not an integer", z);
#endif
#if SEXP_USE_BIGNUMS
    } else if ((sexp_flonum_value(z) > (double)SEXP_MAX_FIXNUM)
               || sexp_flonum_value(z) < (double)SEXP_MIN_FIXNUM) {
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(z));
#endif
    } else {
      res = sexp_make_fixnum((sexp_sint_t)sexp_flonum_value(z));
    }
  }
#endif
#if SEXP_USE_COMPLEX
  else if (sexp_complexp(z)) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
    sexp_complex_real(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_real(z));
    sexp_complex_imag(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_imag(z));
    if (sexp_exceptionp(sexp_complex_real(res)))
      res = sexp_complex_real(res);
    else if (sexp_exceptionp(sexp_complex_imag(res)))
      res = sexp_complex_imag(res);
    else if (sexp_complex_imag(res) == SEXP_ZERO)
      res = sexp_complex_real(res);
    sexp_gc_release1(ctx);
  }
#endif
  else {
    res = sexp_type_exception(ctx, self, SEXP_FLONUM, z);
  }
  return res;
}